

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::setLeaveBound4Row(SPxSolverBase<double> *this,int i,int n)

{
  double *pdVar1;
  pointer pdVar2;
  double dVar3;
  
  switch((this->super_SPxBasisBase<double>).thedesc.rowstat.data[n]) {
  case P_FIXED:
    pdVar1 = (double *)infinity();
    dVar3 = *pdVar1;
    goto LAB_001d50c2;
  default:
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] =
         -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[n];
    pdVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    break;
  case P_ON_LOWER:
    pdVar1 = (double *)infinity();
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -*pdVar1;
    pdVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    break;
  case P_ON_UPPER:
    dVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[n];
LAB_001d50c2:
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -dVar3;
    pdVar1 = (double *)infinity();
    dVar3 = *pdVar1;
    goto LAB_001d516c;
  case P_FREE:
    pdVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -pdVar2[n];
  }
  dVar3 = -pdVar2[n];
LAB_001d516c:
  (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[i] = dVar3;
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   default:
      assert(rep() == COLUMN);
      theLBbound[i] = -this->rhs(n);                // slacks !
      theUBbound[i] = -this->lhs(n);                // slacks !
      break;
   }
}